

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O1

void __thiscall TypeChecker::visit(TypeChecker *this,BinaryOpNode *node)

{
  ExpressionNode *pEVar1;
  undefined8 uVar2;
  mapped_type *pmVar3;
  long *plVar4;
  _Optional_payload_base<TypeName> _Var5;
  size_type *psVar6;
  optional<TypeName> rightType;
  optional<TypeName> leftType;
  TypeChecker checker;
  undefined8 local_80;
  undefined8 local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined **local_30;
  int local_28;
  uint uStack_24;
  SymbolTable *local_20;
  
  local_20 = this->symbols_;
  local_30 = &PTR__Visitor_00156e60;
  uStack_24 = uStack_24 & 0xffffff00;
  pEVar1 = (node->leftOperand_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_30);
  local_78 = CONCAT44(uStack_24,local_28);
  pEVar1 = (node->rightOperand_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_30);
  uVar2 = CONCAT44(uStack_24,local_28);
  if ((local_78._4_1_ == '\x01') && (local_80._4_1_ = (char)uStack_24, local_80._4_1_ == '\x01')) {
    local_80 = uVar2;
    if ((key_type)local_78 == F32) {
      if (local_28 != 0) goto LAB_00131fe0;
      _Var5._M_payload = (_Storage<TypeName,_true>)0x0;
      _Var5._M_engaged = true;
      _Var5._5_3_ = 0;
    }
    else {
      if ((key_type)local_78 != String) {
LAB_00131fe0:
        pmVar3 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_78);
        std::operator+(&local_50,"Invalid operation on value of type ",pmVar3);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        reportError(&local_70,(Node *)node);
      }
      if (node->operator_ != Addition) {
        pmVar3 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_78);
        std::operator+(&local_50,"Invalid operation on value of type ",pmVar3);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        reportError(&local_70,(Node *)node);
      }
      _Var5._M_payload = (_Storage<TypeName,_true>)0x3;
      _Var5._M_engaged = true;
      _Var5._5_3_ = 0;
      if ((local_28 != 0) && (local_28 != 3)) {
        pmVar3 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)&local_80);
        std::operator+(&local_50,"Cannot concatenate string with ",pmVar3);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_70._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
          local_70.field_2._M_allocated_capacity = *psVar6;
          local_70.field_2._8_8_ = plVar4[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar6;
        }
        local_70._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        reportError(&local_70,(Node *)node);
      }
    }
  }
  else {
    _Var5._M_payload = (_Storage<TypeName,_true>)0x0;
    _Var5._M_engaged = false;
    _Var5._5_3_ = 0;
  }
  (this->type_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> = _Var5;
  return;
}

Assistant:

void TypeChecker::visit(const BinaryOpNode& node)
{
  TypeChecker checker{symbols_};
  node.getLeftOperand().accept(checker);  
  auto leftType = checker.getType();

  node.getRightOperand().accept(checker);
  auto rightType = checker.getType();

  if(!leftType.has_value() || !rightType.has_value())
    type_ = {};
  else if(leftType == TypeName::String)
  {
    if(node.getOperation() != BinaryOperator::Addition)
      reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
    else if(rightType != TypeName::F32 && rightType != TypeName::String)
      reportError("Cannot concatenate string with " +
        TypeNameStrings.at(rightType.value()) + "!", node);

    type_ = TypeName::String;
  }
  else if(leftType == TypeName::F32 && rightType == TypeName::F32)
    type_ = TypeName::F32;
  else
    reportError("Invalid operation on value of type " + 
        TypeNameStrings.at(leftType.value()) + "!", node);
}